

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::String(String *this,usize capacity)

{
  Data *pDVar1;
  usize capacity_local;
  String *this_local;
  
  pDVar1 = (Data *)operator_new__(capacity + 0x21);
  this->data = pDVar1;
  this->data->str = (char *)(this->data + 1);
  *this->data->str = '\0';
  this->data->len = 0;
  this->data->ref = 1;
  this->data->capacity = capacity;
  return;
}

Assistant:

explicit String(usize capacity)
  {
    data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
    data->str = (char*)((byte*)data + sizeof(Data));
    *((char*)data->str) = '\0';
    data->len = 0;
    data->ref = 1;
    data->capacity = capacity;
  }